

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive_tester.h
# Opt level: O3

void __thiscall re2::ExhaustiveTester::~ExhaustiveTester(ExhaustiveTester *this)

{
  pointer pcVar1;
  
  (this->super_RegexpGenerator)._vptr_RegexpGenerator =
       (_func_int **)&PTR__ExhaustiveTester_001561d0;
  pcVar1 = (this->topwrapper_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->topwrapper_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->wrapper_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->wrapper_).field_2) {
    operator_delete(pcVar1);
  }
  StringGenerator::~StringGenerator(&this->strgen_);
  (this->super_RegexpGenerator)._vptr_RegexpGenerator = (_func_int **)&PTR__RegexpGenerator_00156220
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_RegexpGenerator).ops_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_RegexpGenerator).atoms_);
  operator_delete(this);
  return;
}

Assistant:

ExhaustiveTester(int maxatoms,
                   int maxops,
                   const vector<string>& alphabet,
                   const vector<string>& ops,
                   int maxstrlen,
                   const vector<string>& stralphabet,
                   const string& wrapper,
                   const string& topwrapper)
    : RegexpGenerator(maxatoms, maxops, alphabet, ops),
      strgen_(maxstrlen, stralphabet),
      wrapper_(wrapper),
      topwrapper_(topwrapper),
      regexps_(0), tests_(0), failures_(0),
      randomstrings_(0), stringseed_(0), stringcount_(0)  { }